

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pardiso_interface.c
# Opt level: O3

c_int init_linsys_solver_pardiso
                (pardiso_solver **sp,csc *P,csc *A,c_float sigma,c_float *rho_vec,c_int polish)

{
  void **pt;
  size_t __size;
  long lVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  pardiso_solver *s;
  c_float *pcVar5;
  c_int *pcVar6;
  csc *pcVar7;
  c_int *pcVar8;
  c_int cVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  c_int **Pdiag_idx;
  c_int *pcVar16;
  c_int *pcVar17;
  
  s = (pardiso_solver *)calloc(1,0x4f8);
  *sp = s;
  lVar1 = P->n;
  s->n = lVar1;
  lVar2 = A->m;
  s->m = lVar2;
  lVar12 = lVar2 + lVar1;
  s->nKKT = lVar12;
  s->sigma = sigma;
  s->polish = polish;
  s->solve = solve_linsys_pardiso;
  s->free = free_linsys_solver_pardiso;
  s->update_matrices = update_linsys_solver_matrices_pardiso;
  s->update_rho_vec = update_linsys_solver_rho_vec_pardiso;
  s->type = MKL_PARDISO_SOLVER;
  __size = lVar12 * 8;
  pcVar5 = (c_float *)malloc(__size);
  s->bp = pcVar5;
  pcVar5 = (c_float *)malloc(__size);
  s->sol = pcVar5;
  pcVar5 = (c_float *)malloc(__size);
  s->rho_inv_vec = pcVar5;
  auVar4 = _DAT_0010ec40;
  if (polish == 0) {
    pcVar6 = (c_int *)malloc(P->p[lVar1] << 3);
    s->PtoKKT = pcVar6;
    pcVar8 = (c_int *)malloc(A->p[A->n] << 3);
    s->AtoKKT = pcVar8;
    pcVar17 = (c_int *)malloc(lVar2 * 8);
    s->rhotoKKT = pcVar17;
    if (0 < lVar2) {
      lVar11 = 0;
      do {
        pcVar5[lVar11] = 1.0 / rho_vec[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar2 != lVar11);
    }
    Pdiag_idx = &s->Pdiag_idx;
    pcVar16 = &s->Pdiag_n;
  }
  else {
    if (0 < lVar2) {
      lVar11 = lVar2 + -1;
      auVar15._8_4_ = (int)lVar11;
      auVar15._0_8_ = lVar11;
      auVar15._12_4_ = (int)((ulong)lVar11 >> 0x20);
      uVar10 = 0;
      auVar15 = auVar15 ^ _DAT_0010ec40;
      auVar13 = _DAT_0010ec30;
      do {
        auVar14 = auVar13 ^ auVar4;
        if ((bool)(~(auVar14._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar14._0_4_ ||
                    auVar15._4_4_ < auVar14._4_4_) & 1)) {
          pcVar5[uVar10] = sigma;
        }
        if ((auVar14._12_4_ != auVar15._12_4_ || auVar14._8_4_ <= auVar15._8_4_) &&
            auVar14._12_4_ <= auVar15._12_4_) {
          pcVar5[uVar10 + 1] = sigma;
        }
        uVar10 = uVar10 + 2;
        lVar11 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 2;
        auVar13._8_8_ = lVar11 + 2;
      } while ((lVar2 + 1U & 0xfffffffffffffffe) != uVar10);
    }
    Pdiag_idx = (c_int **)0x0;
    pcVar16 = (c_int *)0x0;
    pcVar17 = (c_int *)0x0;
    pcVar6 = (c_int *)0x0;
    pcVar8 = (c_int *)0x0;
  }
  pcVar7 = form_KKT(P,A,1,sigma,pcVar5,pcVar6,pcVar8,Pdiag_idx,pcVar16,pcVar17);
  s->KKT = pcVar7;
  if (pcVar7 == (csc *)0x0) {
    printf("ERROR in %s: ","init_linsys_solver_pardiso");
    printf("Error in forming KKT matrix");
    putchar(10);
    free_linsys_solver_pardiso(s);
  }
  else {
    lVar11 = pcVar7->m;
    pcVar6 = pcVar7->p;
    lVar3 = pcVar6[lVar11];
    pcVar8 = (c_int *)malloc(lVar3 * 8);
    s->KKT_i = pcVar8;
    pcVar17 = (c_int *)malloc(lVar11 * 8 + 8);
    s->KKT_p = pcVar17;
    if (0 < lVar3) {
      pcVar16 = pcVar7->i;
      lVar11 = 0;
      do {
        pcVar8[lVar11] = pcVar16[lVar11] + 1;
        lVar11 = lVar11 + 1;
      } while (lVar3 != lVar11);
    }
    if (-1 < lVar12) {
      lVar12 = 0;
      do {
        pcVar17[lVar12] = pcVar6[lVar12] + 1;
        lVar12 = lVar12 + 1;
      } while (lVar1 + lVar2 + 1 != lVar12);
    }
    mkl_set_interface_layer(1);
    s->mtype = -2;
    s->nrhs = 1;
    s->maxfct = 1;
    s->mnum = 1;
    pt = s->pt;
    memset(pt,0,0x200);
    s->error = 0;
    s->msglvl = 0;
    lVar12 = 0x50;
    do {
      s->pt[lVar12 + -0x10] = (void *)0x0;
      (s->pt + lVar12 + -0x10)[1] = (void *)0x0;
      lVar12 = lVar12 + 2;
    } while (lVar12 != 0x90);
    s->iparm[0] = 1;
    s->iparm[1] = 3;
    s->iparm[5] = (ulong)(polish != 0);
    s->iparm[7] = 0;
    s->iparm[9] = 0xd;
    s->iparm[0x22] = 0;
    cVar9 = mkl_get_max_threads();
    s->nthreads = cVar9;
    s->phase = 0xb;
    pcVar5 = &s->fdum;
    pardiso(pt,&s->maxfct,&s->mnum,&s->mtype,&s->phase,&s->nKKT,s->KKT->x,s->KKT_p,s->KKT_i,&s->idum
            ,&s->nrhs,s->iparm,&s->msglvl,pcVar5,pcVar5,&s->error);
    if (s->error == 0) {
      s->phase = 0x16;
      pardiso(pt,&s->maxfct,&s->mnum,&s->mtype,&s->phase,&s->nKKT,s->KKT->x,s->KKT_p,s->KKT_i,
              &s->idum,&s->nrhs,s->iparm,&s->msglvl,pcVar5,pcVar5,&s->error);
      if (s->error == 0) {
        return 0;
      }
      printf("ERROR in %s: ","init_linsys_solver_pardiso");
      printf("Error during numerical factorization: %d",(ulong)(uint)s->error);
      putchar(10);
      free_linsys_solver_pardiso(s);
      *sp = (pardiso_solver *)0x0;
    }
    else {
      printf("ERROR in %s: ","init_linsys_solver_pardiso");
      printf("Error during symbolic factorization: %d",(ulong)(uint)s->error);
      putchar(10);
      free_linsys_solver_pardiso(s);
      *sp = (pardiso_solver *)0x0;
    }
  }
  return 4;
}

Assistant:

c_int init_linsys_solver_pardiso(pardiso_solver ** sp, const csc * P, const csc * A, c_float sigma, const c_float * rho_vec, c_int polish){
    c_int i;                     // loop counter
    c_int nnzKKT;                // Number of nonzeros in KKT
    // Define Variables
    c_int n_plus_m;              // n_plus_m dimension


    // Allocate private structure to store KKT factorization
    pardiso_solver *s;
    s = c_calloc(1, sizeof(pardiso_solver));
    *sp = s;

    // Size of KKT
    s->n = P->n;
    s->m = A->m;
    n_plus_m = s->n + s->m;
    s->nKKT = n_plus_m;

    // Sigma parameter
    s->sigma = sigma;

    // Polishing flag
    s->polish = polish;

    // Link Functions
    s->solve = &solve_linsys_pardiso;
    s->free = &free_linsys_solver_pardiso;
    s->update_matrices = &update_linsys_solver_matrices_pardiso;
    s->update_rho_vec = &update_linsys_solver_rho_vec_pardiso;

    // Assign type
    s->type = MKL_PARDISO_SOLVER;

    // Working vector
    s->bp = (c_float *)c_malloc(sizeof(c_float) * n_plus_m);

    // Solution vector
    s->sol  = (c_float *)c_malloc(sizeof(c_float) * n_plus_m);

    // Parameter vector
    s->rho_inv_vec = (c_float *)c_malloc(sizeof(c_float) * n_plus_m);

    // Form KKT matrix
    if (polish){ // Called from polish()
        // Use s->rho_inv_vec for storing param2 = vec(delta)
        for (i = 0; i < A->m; i++){
            s->rho_inv_vec[i] = sigma;
        }

        s->KKT = form_KKT(P, A, 1, sigma, s->rho_inv_vec, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL);
    }
    else { // Called from ADMM algorithm

        // Allocate vectors of indices
        s->PtoKKT = c_malloc((P->p[P->n]) * sizeof(c_int));
        s->AtoKKT = c_malloc((A->p[A->n]) * sizeof(c_int));
        s->rhotoKKT = c_malloc((A->m) * sizeof(c_int));

        // Use s->rho_inv_vec for storing param2 = rho_inv_vec
        for (i = 0; i < A->m; i++){
            s->rho_inv_vec[i] = 1. / rho_vec[i];
        }

        s->KKT = form_KKT(P, A, 1, sigma, s->rho_inv_vec,
                             s->PtoKKT, s->AtoKKT,
                             &(s->Pdiag_idx), &(s->Pdiag_n), s->rhotoKKT);
    }

    // Check if matrix has been created
    if (!(s->KKT)) {
#ifdef PRINTING
	    c_eprint("Error in forming KKT matrix");
#endif
        free_linsys_solver_pardiso(s);
        return OSQP_LINSYS_SOLVER_INIT_ERROR;
    } else {
	    // Adjust indexing for Pardiso
	    nnzKKT = s->KKT->p[s->KKT->m];
	    s->KKT_i = c_malloc((nnzKKT) * sizeof(c_int));
	    s->KKT_p = c_malloc((s->KKT->m + 1) * sizeof(c_int));

	    for(i = 0; i < nnzKKT; i++){
	    	s->KKT_i[i] = s->KKT->i[i] + 1;
	    }
	    for(i = 0; i < n_plus_m+1; i++){
	    	s->KKT_p[i] = s->KKT->p[i] + 1;
	    }

    }

    // Set MKL interface layer (Long integers if activated)
#ifdef DLONG
    mkl_set_interface_layer(MKL_INTERFACE_ILP64);
#else
    mkl_set_interface_layer(MKL_INTERFACE_LP64);
#endif

    // Set Pardiso variables
    s->mtype = -2;        // Real symmetric indefinite matrix
    s->nrhs = 1;          // Number of right hand sides
    s->maxfct = 1;        // Maximum number of numerical factorizations
    s->mnum = 1;          // Which factorization to use
    s->msglvl = 0;        // Do not print statistical information
    s->error = 0;         // Initialize error flag
    for ( i = 0; i < 64; i++ ) {
        s->iparm[i] = 0;  // Setup Pardiso control parameters
        s->pt[i] = 0;     // Initialize the internal solver memory pointer
    }
    s->iparm[0] = 1;      // No solver default
    s->iparm[1] = 3;      // Fill-in reordering from OpenMP
    if (polish) {
        s->iparm[5] = 1;  // Write solution into b
    } else {
        s->iparm[5] = 0;  // Do NOT write solution into b
    }
    /* s->iparm[7] = 2;      // Max number of iterative refinement steps */
    s->iparm[7] = 0;      // Number of iterative refinement steps (auto, performs them only if perturbed pivots are obtained)
    s->iparm[9] = 13;     // Perturb the pivot elements with 1E-13
    s->iparm[34] = 0;     // Use Fortran-style indexing for indices
    /* s->iparm[34] = 1;     // Use C-style indexing for indices */

    // Print number of threads
    s->nthreads = mkl_get_max_threads();

    // Reordering and symbolic factorization
    s->phase = PARDISO_SYMBOLIC;
    pardiso (s->pt, &(s->maxfct), &(s->mnum), &(s->mtype), &(s->phase),
             &(s->nKKT), s->KKT->x, s->KKT_p, s->KKT_i, &(s->idum), &(s->nrhs),
             s->iparm, &(s->msglvl), &(s->fdum), &(s->fdum), &(s->error));
    if ( s->error != 0 ){
#ifdef PRINTING
        c_eprint("Error during symbolic factorization: %d", (int)s->error);
#endif
        free_linsys_solver_pardiso(s);
        *sp = OSQP_NULL;
        return OSQP_LINSYS_SOLVER_INIT_ERROR;
    }

    // Numerical factorization
    s->phase = PARDISO_NUMERIC;
    pardiso (s->pt, &(s->maxfct), &(s->mnum), &(s->mtype), &(s->phase),
             &(s->nKKT), s->KKT->x, s->KKT_p, s->KKT_i, &(s->idum), &(s->nrhs),
             s->iparm, &(s->msglvl), &(s->fdum), &(s->fdum), &(s->error));
    if ( s->error ){
#ifdef PRINTING
        c_eprint("Error during numerical factorization: %d", (int)s->error);
#endif
        free_linsys_solver_pardiso(s);
        *sp = OSQP_NULL;
        return OSQP_LINSYS_SOLVER_INIT_ERROR;
    }


    // No error
    return 0;
}